

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::~SharedCodeGenerator
          (SharedCodeGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->options_).output_list_file._M_dataplus._M_p;
  paVar1 = &(this->options_).output_list_file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->options_).annotation_list_file._M_dataplus._M_p;
  paVar1 = &(this->options_).annotation_list_file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  internal::scoped_ptr<google::protobuf::compiler::java::ClassNameResolver>::~scoped_ptr
            (&this->name_resolver_);
  return;
}

Assistant:

SharedCodeGenerator::~SharedCodeGenerator() {
}